

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_secp256k1.cpp
# Opt level: O0

void __thiscall
Secp256k1_CombinePubkeySecp256k1EcTest_Test::TestBody
          (Secp256k1_CombinePubkeySecp256k1EcTest_Test *this)

{
  bool bVar1;
  reference paVar2;
  char *message;
  AssertHelper local_108;
  Message local_100;
  string local_f8;
  undefined1 local_d8 [8];
  AssertionResult gtest_ar;
  Message local_c0 [2];
  ByteData local_b0;
  undefined1 local_88 [8];
  ByteData actual;
  CombinePubkeyTestVector test_vector;
  const_iterator __end1;
  const_iterator __begin1;
  vector<CombinePubkeyTestVector,_std::allocator<CombinePubkeyTestVector>_> *__range1;
  Secp256k1 secp;
  secp256k1_context_struct *cxt;
  Secp256k1_CombinePubkeySecp256k1EcTest_Test *this_local;
  
  secp.secp256k1_context_ = wally_get_secp_context();
  cfd::core::Secp256k1::Secp256k1((Secp256k1 *)&__range1,secp.secp256k1_context_);
  __end1 = std::vector<CombinePubkeyTestVector,_std::allocator<CombinePubkeyTestVector>_>::begin
                     (&combine_test_vectors);
  test_vector.expect.field_2._8_8_ =
       std::vector<CombinePubkeyTestVector,_std::allocator<CombinePubkeyTestVector>_>::end
                 (&combine_test_vectors);
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end1,(__normal_iterator<const_CombinePubkeyTestVector_*,_std::vector<CombinePubkeyTestVector,_std::allocator<CombinePubkeyTestVector>_>_>
                                     *)((long)&test_vector.expect.field_2 + 8)), bVar1) {
    paVar2 = __gnu_cxx::
             __normal_iterator<const_CombinePubkeyTestVector_*,_std::vector<CombinePubkeyTestVector,_std::allocator<CombinePubkeyTestVector>_>_>
             ::operator*(&__end1);
    anon_struct_56_2_5c921040::CombinePubkeyTestVector
              ((anon_struct_56_2_5c921040 *)
               &actual.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage,paVar2);
    cfd::core::ByteData::ByteData((ByteData *)local_88);
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      bVar1 = testing::internal::AlwaysTrue();
      if (bVar1) {
        cfd::core::Secp256k1::CombinePubkeySecp256k1Ec
                  (&local_b0,(Secp256k1 *)&__range1,
                   (vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_> *)
                   &actual.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_end_of_storage);
        cfd::core::ByteData::operator=((ByteData *)local_88,&local_b0);
        cfd::core::ByteData::~ByteData(&local_b0);
      }
    }
    else {
      testing::Message::Message(local_c0);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar.message_,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_secp256k1.cpp"
                 ,99,
                 "Expected: actual = secp.CombinePubkeySecp256k1Ec(test_vector.pubkeys) doesn\'t throw an exception.\n  Actual: it throws."
                );
      testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar.message_,local_c0);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar.message_);
      testing::Message::~Message(local_c0);
    }
    cfd::core::ByteData::GetHex_abi_cxx11_(&local_f8,(ByteData *)local_88);
    testing::internal::EqHelper<false>::Compare<std::__cxx11::string,std::__cxx11::string>
              ((EqHelper<false> *)local_d8,"test_vector.expect","actual.GetHex()",
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               &test_vector.pubkeys.
                super__Vector_base<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage,&local_f8);
    std::__cxx11::string::~string((string *)&local_f8);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_d8);
    if (!bVar1) {
      testing::Message::Message(&local_100);
      message = testing::AssertionResult::failure_message((AssertionResult *)local_d8);
      testing::internal::AssertHelper::AssertHelper
                (&local_108,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_secp256k1.cpp"
                 ,100,message);
      testing::internal::AssertHelper::operator=(&local_108,&local_100);
      testing::internal::AssertHelper::~AssertHelper(&local_108);
      testing::Message::~Message(&local_100);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_d8);
    cfd::core::ByteData::~ByteData((ByteData *)local_88);
    anon_struct_56_2_5c921040::~CombinePubkeyTestVector
              ((anon_struct_56_2_5c921040 *)
               &actual.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage);
    __gnu_cxx::
    __normal_iterator<const_CombinePubkeyTestVector_*,_std::vector<CombinePubkeyTestVector,_std::allocator<CombinePubkeyTestVector>_>_>
    ::operator++(&__end1);
  }
  return;
}

Assistant:

TEST(Secp256k1, CombinePubkeySecp256k1EcTest) {
  struct secp256k1_context_struct *cxt = wally_get_secp_context();
  Secp256k1 secp = Secp256k1(cxt);
  for (CombinePubkeyTestVector test_vector : combine_test_vectors) {
    ByteData actual;
    EXPECT_NO_THROW(
        actual = secp.CombinePubkeySecp256k1Ec(test_vector.pubkeys));
    EXPECT_EQ(test_vector.expect, actual.GetHex());
  }
}